

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

void ptls_aead__do_encrypt
               (ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq,
               void *aad,size_t aadlen,ptls_aead_supplementary_encryption_t *supp)

{
  undefined1 local_48 [8];
  ptls_iovec_t invec;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *ctx_local;
  
  invec.len = (size_t)aad;
  _local_48 = ptls_iovec_init(input,inlen);
  (*ctx->do_encrypt_v)(ctx,output,(ptls_iovec_t *)local_48,1,seq,(void *)invec.len,aadlen);
  if (supp != (ptls_aead_supplementary_encryption_t *)0x0) {
    ptls_cipher_init(supp->ctx,supp->input);
    memset(supp->output,0,0x10);
    ptls_cipher_encrypt(supp->ctx,supp->output,supp->output,0x10);
  }
  return;
}

Assistant:

inline void ptls_aead__do_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                  const void *aad, size_t aadlen, ptls_aead_supplementary_encryption_t *supp)
{
    ptls_iovec_t invec = ptls_iovec_init(input, inlen);
    ctx->do_encrypt_v(ctx, output, &invec, 1, seq, aad, aadlen);

    if (supp != NULL) {
        ptls_cipher_init(supp->ctx, supp->input);
        memset(supp->output, 0, sizeof(supp->output));
        ptls_cipher_encrypt(supp->ctx, supp->output, supp->output, sizeof(supp->output));
    }
}